

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined4 uVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  uVar3 = (uint)((byte)*in_text >> 3);
  lVar12 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar3];
  lVar5 = lVar12 + (ulong)((0x80ff0000U >> uVar3 & 1) != 0);
  pbVar8 = (byte *)(in_text + lVar5);
  if (in_text_end != (char *)0x0) {
    pbVar8 = (byte *)in_text_end;
  }
  uVar9 = 0;
  uVar3 = (uint)(byte)*in_text;
  if (pbVar8 <= in_text) {
    uVar3 = uVar9;
  }
  if (in_text + 1 < pbVar8) {
    uVar9 = (uint)(byte)in_text[1];
  }
  pbVar11 = (byte *)(in_text + 2);
  if (pbVar11 < pbVar8) {
    uVar13 = (uint)CONCAT71((int7)((ulong)pbVar11 >> 8),*pbVar11);
  }
  else {
    uVar13 = 0;
  }
  pbVar11 = (byte *)(in_text + 3);
  if (pbVar11 < pbVar8) {
    uVar10 = (uint)CONCAT71((int7)((ulong)pbVar11 >> 8),*pbVar11);
  }
  else {
    uVar10 = 0;
  }
  uVar14 = (uVar10 & 0x3f |
           (uVar13 & 0x3f) << 6 |
           (uVar9 & 0x3f) << 0xc | (uVar3 & ImTextCharFromUtf8::masks[lVar12]) << 0x12) >>
           (*(byte *)(ImTextCharFromUtf8::shiftc + lVar12) & 0x1f);
  *out_char = uVar14;
  iVar4 = (int)lVar5;
  if ((((uVar9 >> 2 & 0xfffffff0) + ((uVar13 & 0xff) >> 6) * 4 | (uVar10 & 0xff) >> 6 |
        (uint)(uVar14 < ImTextCharFromUtf8::mins[lVar12]) << 6 | (uint)(0xffff < uVar14) << 8 |
       (uint)((uVar14 & 0x7ffff800) == 0xd800) << 7) ^ 0x2a) >>
      (*(byte *)(ImTextCharFromUtf8::shifte + lVar12) & 0x1f) != 0) {
    auVar2 = vpinsrb_avx(ZEXT416(uVar9),uVar3,1);
    auVar2 = vpinsrb_avx(auVar2,uVar13,2);
    auVar2 = vpinsrb_avx(auVar2,uVar10,3);
    auVar2 = vpcmpeqb_avx(auVar2,(undefined1  [16])0x0);
    auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
    auVar2 = vpmovsxbd_avx(auVar2 ^ auVar1);
    uVar6 = vmovmskps_avx(auVar2);
    iVar7 = POPCOUNT(uVar6);
    if (iVar4 < POPCOUNT(uVar6)) {
      iVar7 = iVar4;
    }
    *out_char = 0xfffd;
    return iVar7;
  }
  return iVar4;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    static const char lengths[32] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0 };
    static const int masks[]  = { 0x00, 0x7f, 0x1f, 0x0f, 0x07 };
    static const uint32_t mins[] = { 0x400000, 0, 0x80, 0x800, 0x10000 };
    static const int shiftc[] = { 0, 18, 12, 6, 0 };
    static const int shifte[] = { 0, 6, 4, 2, 0 };
    int len = lengths[*(const unsigned char*)in_text >> 3];
    int wanted = len + !len;

    if (in_text_end == NULL)
        in_text_end = in_text + wanted; // Max length, nulls will be taken into account.

    // Copy at most 'len' bytes, stop copying at 0 or past in_text_end. Branch predictor does a good job here,
    // so it is fast even with excessive branching.
    unsigned char s[4];
    s[0] = in_text + 0 < in_text_end ? in_text[0] : 0;
    s[1] = in_text + 1 < in_text_end ? in_text[1] : 0;
    s[2] = in_text + 2 < in_text_end ? in_text[2] : 0;
    s[3] = in_text + 3 < in_text_end ? in_text[3] : 0;

    // Assume a four-byte character and load four bytes. Unused bits are shifted out.
    *out_char  = (uint32_t)(s[0] & masks[len]) << 18;
    *out_char |= (uint32_t)(s[1] & 0x3f) << 12;
    *out_char |= (uint32_t)(s[2] & 0x3f) <<  6;
    *out_char |= (uint32_t)(s[3] & 0x3f) <<  0;
    *out_char >>= shiftc[len];

    // Accumulate the various error conditions.
    int e = 0;
    e  = (*out_char < mins[len]) << 6; // non-canonical encoding
    e |= ((*out_char >> 11) == 0x1b) << 7;  // surrogate half?
    e |= (*out_char > IM_UNICODE_CODEPOINT_MAX) << 8;  // out of range?
    e |= (s[1] & 0xc0) >> 2;
    e |= (s[2] & 0xc0) >> 4;
    e |= (s[3]       ) >> 6;
    e ^= 0x2a; // top two bits of each tail byte correct?
    e >>= shifte[len];

    if (e)
    {
        // No bytes are consumed when *in_text == 0 || in_text == in_text_end.
        // One byte is consumed in case of invalid first byte of in_text.
        // All available bytes (at most `len` bytes) are consumed on incomplete/invalid second to last bytes.
        // Invalid or incomplete input may consume less bytes than wanted, therefore every byte has to be inspected in s.
        wanted = ImMin(wanted, !!s[0] + !!s[1] + !!s[2] + !!s[3]);
        *out_char = IM_UNICODE_CODEPOINT_INVALID;
    }

    return wanted;
}